

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  AbstractSocketWriter *pAVar1;
  StreamingListener *in_RDI;
  string *in_stack_ffffffffffffff88;
  string local_50 [23];
  undefined1 in_stack_ffffffffffffffc7;
  undefined8 in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  UnitTest::Passed((UnitTest *)0x18ff72);
  FormatBool_abi_cxx11_
            ((StreamingListener *)in_stack_ffffffffffffffc8,(bool)in_stack_ffffffffffffffc7);
  std::operator+(&local_30,"event=TestProgramEnd&passed=",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  SendLn(in_RDI,in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string(local_50);
  pAVar1 = scoped_ptr<testing::internal::StreamingListener::AbstractSocketWriter>::operator->
                     (&in_RDI->socket_writer_);
  (*pAVar1->_vptr_AbstractSocketWriter[3])();
  return;
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    SendLn("event=TestProgramEnd&passed=" + FormatBool(unit_test.Passed()));

    // Notify the streaming server to stop.
    socket_writer_->CloseConnection();
  }